

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int handle_key_update(ptls_t *tls,ptls_message_emitter_t *emitter,ptls_iovec_t message)

{
  int iVar1;
  
  iVar1 = 0x32;
  if (((message.base == (uint8_t *)0x5) && (*(byte *)((long)&emitter->buf + 4) < 2)) &&
     (iVar1 = update_traffic_key(tls,0), iVar1 == 0)) {
    if (*(char *)((long)&emitter->buf + 4) != '\0') {
      if (tls->ctx->update_traffic_key != (ptls_update_traffic_key_t *)0x0) {
        return 10;
      }
      tls->field_0x160 = tls->field_0x160 | 8;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int handle_key_update(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_iovec_t message)
{
    const uint8_t *src = message.base + PTLS_HANDSHAKE_HEADER_SIZE, *const end = message.base + message.len;
    int ret;

    /* validate */
    if (end - src != 1 || *src > 1)
        return PTLS_ALERT_DECODE_ERROR;

    /* update receive key */
    if ((ret = update_traffic_key(tls, 0)) != 0)
        return ret;

    if (*src) {
        if (tls->ctx->update_traffic_key != NULL)
            return PTLS_ALERT_UNEXPECTED_MESSAGE;
        tls->needs_key_update = 1;
    }

    return 0;
}